

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O1

int WebPInitDecoderConfigInternal(WebPDecoderConfig *config,int version)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = 0;
  if (config != (WebPDecoderConfig *)0x0 && (version & 0xffffff00U) == 0x200) {
    memset(config,0,0xf0);
    iVar2 = WebPInitDecBufferInternal(&config->output,0x210);
    uVar1 = (uint)(iVar2 != 0);
  }
  return uVar1;
}

Assistant:

int WebPInitDecoderConfigInternal(WebPDecoderConfig* config,
                                  int version) {
  if (WEBP_ABI_IS_INCOMPATIBLE(version, WEBP_DECODER_ABI_VERSION)) {
    return 0;   // version mismatch
  }
  if (config == NULL) {
    return 0;
  }
  memset(config, 0, sizeof(*config));
  DefaultFeatures(&config->input);
  if (!WebPInitDecBuffer(&config->output)) {
    return 0;
  }
  return 1;
}